

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O1

void th06_dump(thecl_t *ecl,FILE *out)

{
  thecl_instr_type tVar1;
  uint uVar2;
  thecl_sub_t *sub;
  thecl_instr_t *ptVar3;
  void *pvVar4;
  thecl_param_t *ptVar5;
  bool bVar6;
  uint uVar7;
  list_node_t *plVar8;
  seqmap_entry_t *psVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  list_node_t *plVar16;
  list_node_t *plVar17;
  char *pcVar18;
  long *plVar19;
  char *pcVar20;
  uint local_3c;
  
  if (out == (FILE *)0x0 || ecl == (thecl_t *)0x0) {
    return;
  }
  plVar8 = (list_node_t *)&ecl->subs;
LAB_001172fc:
  plVar8 = plVar8->next;
  if (plVar8 != (list_node_t *)0x0) {
    sub = (thecl_sub_t *)plVar8->data;
    local_3c = 0;
    fprintf((FILE *)out,"\nsub %s()\n{\n",sub->name);
    plVar16 = (list_node_t *)&sub->instrs;
    do {
      plVar16 = plVar16->next;
      if (plVar16 == (list_node_t *)0x0) goto LAB_001175ce;
      ptVar3 = (thecl_instr_t *)plVar16->data;
      switch(ptVar3->type) {
      case THECL_INSTR_INSTR:
        if (g_ecl_hexdebug == true) {
          fprintf((FILE *)out,"    /* %5x (+%5x) */ ",(ulong)ptVar3->address,(ulong)ptVar3->offset);
        }
        else {
          fwrite("    ",4,1,(FILE *)out);
        }
        psVar9 = seqmap_get(g_eclmap->ins_names,ptVar3->id);
        if (psVar9 == (seqmap_entry_t *)0x0) {
          fprintf((FILE *)out,"ins_%u(",(ulong)ptVar3->id);
        }
        else {
          fprintf((FILE *)out,"%s(",psVar9->value);
        }
        plVar17 = (list_node_t *)&ptVar3->params;
        bVar6 = false;
        while (plVar17 = plVar17->next, plVar17 != (list_node_t *)0x0) {
          ptVar5 = (thecl_param_t *)plVar17->data;
          if (bVar6) {
            fwrite(", ",2,1,(FILE *)out);
          }
          pcVar11 = th06_stringify_param(sub,ptVar3,ptVar5,ecl->version);
          fputs(pcVar11,(FILE *)out);
          free(pcVar11);
          bVar6 = true;
        }
        fwrite(");\n",3,1,(FILE *)out);
        break;
      case THECL_INSTR_TIME:
        fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - local_3c));
        local_3c = ptVar3->time;
        break;
      case THECL_INSTR_RANK:
        uVar2 = ptVar3->rank;
        if (uVar2 == 0xff) {
          pcVar11 = "!*";
        }
        else {
          uVar7 = get_default_none_rank(ecl->version);
          if (uVar2 != uVar7) {
            uVar2 = ptVar3->rank;
            pcVar11 = "E";
            pcVar18 = "";
            if ((uVar2 & 1) == 0) {
              pcVar11 = "";
            }
            pcVar10 = "N";
            if ((uVar2 & 2) == 0) {
              pcVar10 = "";
            }
            pcVar12 = "H";
            if ((uVar2 & 4) == 0) {
              pcVar12 = "";
            }
            pcVar13 = "L";
            if ((uVar2 & 8) == 0) {
              pcVar13 = "";
            }
            pcVar14 = "";
            if ((uVar2 & 0x10) == 0) {
              pcVar14 = "4";
            }
            pcVar15 = "";
            if ((uVar2 & 0x20) == 0) {
              pcVar15 = "5";
            }
            pcVar20 = "";
            if ((uVar2 & 0x40) == 0) {
              pcVar20 = "6";
            }
            if (-1 < (char)uVar2) {
              pcVar18 = "7";
            }
            fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s",pcVar11,pcVar10,pcVar12,pcVar13,pcVar14,pcVar15,
                    pcVar20,pcVar18);
            break;
          }
          pcVar11 = "!-";
        }
        fwrite(pcVar11,2,1,(FILE *)out);
        break;
      case THECL_INSTR_LABEL:
        fprintf((FILE *)out,"%s_%u:\n",sub->name,(ulong)ptVar3->offset);
        break;
      default:
        goto switchD_0011736c_default;
      }
    } while( true );
  }
  plVar8 = (list_node_t *)&ecl->timelines;
  goto LAB_001175f5;
LAB_001175ce:
  fwrite("}\n",2,1,(FILE *)out);
  goto LAB_001172fc;
LAB_001175f5:
  plVar8 = plVar8->next;
  if (plVar8 == (list_node_t *)0x0) {
    return;
  }
  pvVar4 = plVar8->data;
  uVar2 = 0;
  fprintf((FILE *)out,"\ntimeline %s()\n{\n",pvVar4);
  plVar19 = (long *)((long)pvVar4 + 0x100);
LAB_00117636:
  plVar19 = (long *)*plVar19;
  if (plVar19 == (long *)0x0) goto LAB_0011785a;
  ptVar3 = (thecl_instr_t *)plVar19[2];
  tVar1 = ptVar3->type;
  if (tVar1 == THECL_INSTR_INSTR) {
    psVar9 = seqmap_get(g_eclmap->timeline_ins_names,ptVar3->id);
    if (psVar9 == (seqmap_entry_t *)0x0) {
      fprintf((FILE *)out,"    ins_%u(",(ulong)ptVar3->id);
    }
    else {
      fprintf((FILE *)out,"    %s(",psVar9->value);
    }
    plVar16 = (list_node_t *)&ptVar3->params;
    bVar6 = false;
    while (plVar16 = plVar16->next, plVar16 != (list_node_t *)0x0) {
      ptVar5 = (thecl_param_t *)plVar16->data;
      if (bVar6) {
        fwrite(", ",2,1,(FILE *)out);
      }
      pcVar11 = th06_stringify_param((thecl_sub_t *)0x0,ptVar3,ptVar5,ecl->version);
      fputs(pcVar11,(FILE *)out);
      free(pcVar11);
      bVar6 = true;
    }
    pcVar11 = ");\n";
  }
  else {
    if (tVar1 != THECL_INSTR_RANK) {
      if (tVar1 != THECL_INSTR_TIME) {
switchD_0011736c_default:
        abort();
      }
      if (ptVar3->time == 0xffff) {
        fprintf((FILE *)out,"%u:\n",0xffff);
      }
      else {
        fprintf((FILE *)out,"+%u: //%u\n",(ulong)(ptVar3->time - uVar2));
      }
      uVar2 = ptVar3->time;
      goto LAB_00117636;
    }
    uVar7 = ptVar3->rank;
    if (uVar7 == 0xf0) {
      pcVar11 = "!-\n";
      goto LAB_00117764;
    }
    if (uVar7 != 0xff) {
      pcVar11 = "E";
      pcVar18 = "";
      if ((uVar7 & 1) == 0) {
        pcVar11 = "";
      }
      pcVar10 = "N";
      if ((uVar7 & 2) == 0) {
        pcVar10 = "";
      }
      pcVar12 = "H";
      if ((uVar7 & 4) == 0) {
        pcVar12 = "";
      }
      pcVar13 = "L";
      if ((uVar7 & 8) == 0) {
        pcVar13 = "";
      }
      pcVar14 = "";
      if ((uVar7 & 0x10) == 0) {
        pcVar14 = "4";
      }
      pcVar15 = "";
      if ((uVar7 & 0x20) == 0) {
        pcVar15 = "5";
      }
      pcVar20 = "";
      if ((uVar7 & 0x40) == 0) {
        pcVar20 = "6";
      }
      if (-1 < (char)uVar7) {
        pcVar18 = "7";
      }
      fprintf((FILE *)out,"!%s%s%s%s%s%s%s%s\n",pcVar11,pcVar10,pcVar12,pcVar13,pcVar14,pcVar15,
              pcVar20,pcVar18);
      goto LAB_00117636;
    }
    pcVar11 = "!*\n";
  }
LAB_00117764:
  fwrite(pcVar11,3,1,(FILE *)out);
  goto LAB_00117636;
LAB_0011785a:
  fwrite("}\n",2,1,(FILE *)out);
  goto LAB_001175f5;
}

Assistant:

static void
th06_dump(
    const thecl_t* ecl,
    FILE* out)
{
    if (!ecl || !out)
        return;

    thecl_sub_t* sub;
    list_for_each(&ecl->subs, sub) {
        fprintf(out, "\nsub %s()\n{\n", sub->name);

        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&sub->instrs, instr) {
            switch (instr->type) {
            case THECL_INSTR_TIME:
                fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*");
                else if(instr->rank == get_default_none_rank(ecl->version)) fprintf(out, "!-");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_LABEL:
                fprintf(out, "%s_%u:\n", sub->name, instr->offset);
                break;
            case THECL_INSTR_INSTR: {
                if (g_ecl_hexdebug) {
                    fprintf(out, "    /* %5x (+%5x) */ ", instr->address, instr->offset);
                } else {
                    fprintf(out, "    ");
                }
                seqmap_entry_t *ent = seqmap_get(g_eclmap->ins_names, instr->id);
                if (ent) {
                    fprintf(out, "%s(", ent->value);
                } else {
                    fprintf(out, "ins_%u(", instr->id);
                }
                thecl_param_t* param;
                int first = 1;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(sub, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }

        fprintf(out, "}\n");
    }

    thecl_timeline_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        fprintf(out, "\ntimeline %s()\n{\n", timeline->name);
        thecl_instr_t* instr;
        unsigned int time_last = 0;
        list_for_each(&timeline->instrs, instr) {
            switch(instr->type) {
            case THECL_INSTR_TIME:
                if (instr->time != 0xffff) /* The last ins has to always be 0xffff, so let's not make it relative... */
                    fprintf(out, "+%u: //%u\n", instr->time - time_last, instr->time);
                else
                    fprintf(out, "%u:\n", instr->time);
                time_last = instr->time;
                break;
            case THECL_INSTR_RANK:
                if(instr->rank == 0xFF) fprintf(out, "!*\n");
                else if(instr->rank == 0xF0) fprintf(out, "!-\n");
                else {
                    fprintf(out, "!%s%s%s%s%s%s%s%s\n",
                        (instr->rank) & RANK_EASY    ? "E" : "",
                        (instr->rank) & RANK_NORMAL  ? "N" : "",
                        (instr->rank) & RANK_HARD    ? "H" : "",
                        (instr->rank) & RANK_LUNATIC ? "L" : "",
                        !((instr->rank) & RANK_ID_4) ? "4" : "",
                        !((instr->rank) & RANK_ID_5) ? "5" : "",
                        !((instr->rank) & RANK_ID_6) ? "6" : "",
                        !((instr->rank) & RANK_ID_7) ? "7" : "");
                }
                break;
            case THECL_INSTR_INSTR: {
                seqmap_entry_t *ent = seqmap_get(g_eclmap->timeline_ins_names, instr->id);
                if (ent)
                    fprintf(out, "    %s(", ent->value);
                else
                    fprintf(out, "    ins_%u(", instr->id);

                int first = 1;
                thecl_param_t* param;
                list_for_each(&instr->params, param) {
                    if (!first) {
                        fprintf(out, ", ");
                    } else {
                        first = 0;
                    }

                    char* ret = th06_stringify_param(NULL, instr, param, ecl->version);
                    fprintf(out, "%s", ret);
                    free(ret);
                }
                fprintf(out, ");\n");
                break;
            }
            default:
                abort();
            }
        }
        fprintf(out, "}\n");
    }
}